

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O1

void __thiscall
amrex::CoordSys::HiFace
          (CoordSys *this,IntVect *point,int dir,Vector<double,_std::allocator<double>_> *loc)

{
  pointer pdVar1;
  long lVar2;
  
  std::vector<double,_std::allocator<double>_>::resize
            (&loc->super_vector<double,_std::allocator<double>_>,3);
  pdVar1 = (loc->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  lVar2 = 0;
  do {
    *(double *)((long)pdVar1 + lVar2 * 2) =
         ((double)*(int *)((long)point->vect + lVar2) +
         *(double *)(&DAT_007920c0 + (ulong)((ulong)(uint)dir << 2 == lVar2) * 8)) *
         *(double *)((long)this->dx + lVar2 * 2) + *(double *)((long)this->offset + lVar2 * 2);
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0xc);
  return;
}

Assistant:

void
CoordSys::HiFace (const IntVect& point,
                  int            dir,
                  Vector<Real>&   loc) const noexcept
{
    loc.resize(AMREX_SPACEDIM);
    HiFace(point,dir, loc.dataPtr());
}